

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::interval_t,double,duckdb::interval_t,duckdb::BinaryStandardOperatorWrapper,duckdb::MultiplyOperator,bool,true,false>
               (interval_t *ldata,double *rdata,interval_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  idx_t iVar5;
  unsigned_long uVar6;
  ulong uVar7;
  int64_t *piVar8;
  interval_t iVar9;
  interval_t iVar10;
  int64_t *local_68;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      iVar10 = *ldata;
      local_68 = &result_data->micros;
      iVar5 = 0;
      do {
        iVar9 = MultiplyOperator::Operation<duckdb::interval_t,double,duckdb::interval_t>
                          (iVar10,rdata[iVar5]);
        ((interval_t *)(local_68 + -1))->months = (int)iVar9._0_8_;
        ((interval_t *)(local_68 + -1))->days = (int)((ulong)iVar9._0_8_ >> 0x20);
        *local_68 = iVar9.micros;
        iVar5 = iVar5 + 1;
        local_68 = local_68 + 2;
      } while (count != iVar5);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar2 = 0;
    uVar3 = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar6 = 0xffffffffffffffff;
      }
      else {
        uVar6 = puVar1[uVar2];
      }
      uVar7 = uVar3 + 0x40;
      if (count <= uVar3 + 0x40) {
        uVar7 = count;
      }
      uVar4 = uVar7;
      if (uVar6 != 0) {
        uVar4 = uVar3;
        if (uVar6 == 0xffffffffffffffff) {
          if (uVar3 < uVar7) {
            iVar10 = *ldata;
            piVar8 = &result_data[uVar3].micros;
            do {
              iVar9 = MultiplyOperator::Operation<duckdb::interval_t,double,duckdb::interval_t>
                                (iVar10,rdata[uVar4]);
              ((interval_t *)(piVar8 + -1))->months = (int)iVar9._0_8_;
              ((interval_t *)(piVar8 + -1))->days = (int)((ulong)iVar9._0_8_ >> 0x20);
              *piVar8 = iVar9.micros;
              uVar4 = uVar4 + 1;
              piVar8 = piVar8 + 2;
            } while (uVar7 != uVar4);
          }
        }
        else if (uVar3 < uVar7) {
          piVar8 = &result_data[uVar3].micros;
          uVar4 = 0;
          do {
            if ((uVar6 >> (uVar4 & 0x3f) & 1) != 0) {
              iVar10 = MultiplyOperator::Operation<duckdb::interval_t,double,duckdb::interval_t>
                                 (*ldata,rdata[uVar3 + uVar4]);
              ((interval_t *)(piVar8 + -1))->months = (int)iVar10._0_8_;
              ((interval_t *)(piVar8 + -1))->days = (int)((ulong)iVar10._0_8_ >> 0x20);
              *piVar8 = iVar10.micros;
            }
            uVar4 = uVar4 + 1;
            piVar8 = piVar8 + 2;
          } while ((uVar3 - uVar7) + uVar4 != 0);
          uVar4 = uVar3 + uVar4;
        }
      }
      uVar2 = uVar2 + 1;
      uVar3 = uVar4;
    } while (uVar2 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}